

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

IterationResult __thiscall
helics::Federate::enterExecutingMode(Federate *this,IterationRequest iterate)

{
  Modes MVar1;
  IterationResult IVar2;
  element_type *peVar3;
  undefined8 uVar4;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  IterationResult extraout_DL;
  char in_SIL;
  Federate *in_RDI;
  iteration_time iVar5;
  iteration_time result;
  iteration_time ires;
  IterationResult res;
  IterationResult local_99;
  string_view in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff91;
  undefined8 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa1;
  Federate *in_stack_ffffffffffffffb8;
  Federate *in_stack_ffffffffffffffd8;
  IterationResult local_12;
  Federate *this_01;
  
  local_12 = NEXT_STEP;
  this_01 = in_RDI;
  MVar1 = std::atomic::operator_cast_to_Modes((atomic<helics::Federate::Modes> *)0x340f67);
  this_00 = (basic_string_view<char,_std::char_traits<char>_> *)(ulong)MVar1;
  switch(this_00) {
  case (basic_string_view<char,_std::char_traits<char>_> *)0x0:
  case (basic_string_view<char,_std::char_traits<char>_> *)0x5:
    enterInitializingMode((Federate *)CONCAT71(in_stack_ffffffffffffffa1,in_stack_ffffffffffffffa0))
    ;
  case (basic_string_view<char,_std::char_traits<char>_> *)0x1:
    peVar3 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x340fa4);
    (*peVar3->_vptr_Core[0x15])(peVar3,(ulong)(uint)(in_RDI->fedID).fid,(ulong)(uint)(int)in_SIL);
    iVar5.state = in_stack_ffffffffffffffa0;
    iVar5.grantedTime.internalTimeCode = in_stack_ffffffffffffff98;
    iVar5._9_7_ = in_stack_ffffffffffffffa1;
    enteringExecutingMode
              ((Federate *)CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90),iVar5);
    local_12 = extraout_DL;
    break;
  case (basic_string_view<char,_std::char_traits<char>_> *)0x2:
    break;
  default:
    uVar4 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_00,(char *)in_RDI);
    InvalidFunctionCall::InvalidFunctionCall
              ((InvalidFunctionCall *)this_00,in_stack_ffffffffffffff78);
    __cxa_throw(uVar4,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
  case (basic_string_view<char,_std::char_traits<char>_> *)0x6:
    IVar2 = enterExecutingModeComplete(in_stack_ffffffffffffffd8);
    return IVar2;
  case (basic_string_view<char,_std::char_traits<char>_> *)0x7:
    requestTimeComplete(in_stack_ffffffffffffffb8);
    break;
  case (basic_string_view<char,_std::char_traits<char>_> *)0x8:
    iVar5 = requestTimeIterativeComplete(this_01);
    local_99 = iVar5.state;
    if (local_99 == ITERATING) {
      local_99 = NEXT_STEP;
    }
    return local_99;
  }
  return local_12;
}

Assistant:

IterationResult Federate::enterExecutingMode(IterationRequest iterate)
{
    IterationResult res = IterationResult::NEXT_STEP;
    switch (currentMode) {
        case Modes::STARTUP:
        case Modes::PENDING_INIT:
            enterInitializingMode();
            [[fallthrough]];
        case Modes::INITIALIZING: {
            auto ires = coreObject->enterExecutingMode(fedID, iterate);
            enteringExecutingMode(ires);
            res = ires.state;
            break;
        }
        case Modes::PENDING_EXEC:
            return enterExecutingModeComplete();
        case Modes::EXECUTING:
            // already in this state --> do nothing
            break;
        case Modes::PENDING_TIME:
            requestTimeComplete();
            break;
        case Modes::PENDING_ITERATIVE_TIME: {
            auto result = requestTimeIterativeComplete();
            return (result.state == IterationResult::ITERATING) ? IterationResult::NEXT_STEP :
                                                                  result.state;
        }
        default:
            throw(InvalidFunctionCall("cannot transition from current state to execution state"));
            break;
    }
    return res;
}